

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_23::ValidateSymbolName(anon_unknown_23 *this,string_view name)

{
  anon_unknown_23 aVar1;
  anon_unknown_23 *paVar2;
  
  for (paVar2 = (anon_unknown_23 *)0x0; this != paVar2; paVar2 = paVar2 + 1) {
    aVar1 = paVar2[name._M_len];
    if ((((aVar1 != (anon_unknown_23)0x2e) && (aVar1 != (anon_unknown_23)0x5f)) &&
        ((byte)((char)aVar1 - 0x3aU) < 0xf6)) && ((byte)(((byte)aVar1 & 0xdf) + 0xa5) < 0xe6))
    break;
  }
  return this == paVar2;
}

Assistant:

bool ValidateSymbolName(absl::string_view name) {
  for (char c : name) {
    // I don't trust ctype.h due to locales.  :(
    if (c != '.' && c != '_' && (c < '0' || c > '9') && (c < 'A' || c > 'Z') &&
        (c < 'a' || c > 'z')) {
      return false;
    }
  }
  return true;
}